

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

BBox3fa * __thiscall
embree::avx::LineSegmentsISA::vbounds
          (BBox3fa *__return_storage_ptr__,LineSegmentsISA *this,Vec3fa *ofs,float scale,
          float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float fVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  auVar25._4_60_ = in_register_00001204;
  auVar25._0_4_ = scale;
  pBVar3 = (this->super_LineSegments).vertices.items;
  uVar2 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_LineSegments).field_0x68);
  pcVar4 = pBVar3[itime].super_RawBufferView.ptr_ofs;
  sVar5 = pBVar3[itime].super_RawBufferView.stride;
  lVar22 = uVar2 * sVar5;
  lVar21 = (uVar2 + 1) * sVar5;
  auVar7 = vsubps_avx(*(undefined1 (*) [16])(pcVar4 + lVar22),(undefined1  [16])ofs->field_0);
  auVar26 = vshufps_avx(auVar25._0_16_,auVar25._0_16_,0);
  auVar27._0_4_ = auVar26._0_4_ * auVar7._0_4_;
  auVar27._4_4_ = auVar26._4_4_ * auVar7._4_4_;
  auVar27._8_4_ = auVar26._8_4_ * auVar7._8_4_;
  auVar27._12_4_ = auVar26._12_4_ * auVar7._12_4_;
  auVar7 = vshufps_avx(auVar27,auVar27,0);
  auVar6 = vshufps_avx(auVar27,auVar27,0x55);
  auVar23 = vshufps_avx(auVar27,auVar27,0xaa);
  fVar9 = (space->vx).field_0.m128[0];
  fVar10 = (space->vx).field_0.m128[1];
  fVar11 = (space->vx).field_0.m128[2];
  fVar12 = (space->vx).field_0.m128[3];
  fVar13 = (space->vy).field_0.m128[0];
  fVar14 = (space->vy).field_0.m128[1];
  fVar15 = (space->vy).field_0.m128[2];
  fVar16 = (space->vy).field_0.m128[3];
  fVar17 = (space->vz).field_0.m128[0];
  fVar18 = (space->vz).field_0.m128[1];
  fVar19 = (space->vz).field_0.m128[2];
  fVar20 = (space->vz).field_0.m128[3];
  auVar28._0_4_ = auVar7._0_4_ * fVar9 + fVar13 * auVar6._0_4_ + fVar17 * auVar23._0_4_;
  auVar28._4_4_ = auVar7._4_4_ * fVar10 + fVar14 * auVar6._4_4_ + fVar18 * auVar23._4_4_;
  auVar28._8_4_ = auVar7._8_4_ * fVar11 + fVar15 * auVar6._8_4_ + fVar19 * auVar23._8_4_;
  auVar28._12_4_ = auVar7._12_4_ * fVar12 + fVar16 * auVar6._12_4_ + fVar20 * auVar23._12_4_;
  fVar1 = (this->super_LineSegments).maxRadiusScale;
  auVar27 = ZEXT416((uint)(scale * r_scale0 * fVar1 * *(float *)(pcVar4 + lVar22 + 0xc)));
  auVar7 = vinsertps_avx(auVar28,auVar27,0x30);
  auVar6 = vsubps_avx(*(undefined1 (*) [16])(pcVar4 + lVar21),(undefined1  [16])ofs->field_0);
  auVar23._0_4_ = auVar26._0_4_ * auVar6._0_4_;
  auVar23._4_4_ = auVar26._4_4_ * auVar6._4_4_;
  auVar23._8_4_ = auVar26._8_4_ * auVar6._8_4_;
  auVar23._12_4_ = auVar26._12_4_ * auVar6._12_4_;
  auVar26 = vshufps_avx(auVar23,auVar23,0);
  auVar6 = vshufps_avx(auVar23,auVar23,0x55);
  auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
  auVar24._0_4_ = auVar26._0_4_ * fVar9 + fVar13 * auVar6._0_4_ + fVar17 * auVar23._0_4_;
  auVar24._4_4_ = auVar26._4_4_ * fVar10 + fVar14 * auVar6._4_4_ + fVar18 * auVar23._4_4_;
  auVar24._8_4_ = auVar26._8_4_ * fVar11 + fVar15 * auVar6._8_4_ + fVar19 * auVar23._8_4_;
  auVar24._12_4_ = auVar26._12_4_ * fVar12 + fVar16 * auVar6._12_4_ + fVar20 * auVar23._12_4_;
  auVar23 = ZEXT416((uint)(scale * r_scale0 * fVar1 * *(float *)(pcVar4 + lVar21 + 0xc)));
  auVar26 = vinsertps_avx(auVar24,auVar23,0x30);
  auVar6 = vminps_avx(auVar7,auVar26);
  auVar7 = vmaxps_avx(auVar7,auVar26);
  auVar26 = vmaxss_avx(auVar23,auVar27);
  auVar26 = ZEXT416((uint)(fVar1 * auVar26._0_4_));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar6,auVar26);
  (__return_storage_ptr__->lower).field_0 = aVar8;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar7._0_4_ + auVar26._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar7._4_4_ + auVar26._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar7._8_4_ + auVar26._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar7._12_4_ + auVar26._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }